

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest2.cpp
# Opt level: O0

void __thiscall UdpSocketTest::test2(UdpSocketTest *this)

{
  undefined1 local_294 [8];
  Address test_addr;
  int i_3;
  Address sock_addr;
  Socket sock;
  int local_1d4;
  int local_1d0;
  int i_2;
  int i_1;
  int i;
  char buf [128];
  int res;
  Address server_addr2;
  Address server_addr;
  ServerSocket server2;
  ServerSocket server;
  UdpSocketTest *this_local;
  
  JetHead::ServerSocket::ServerSocket((ServerSocket *)&stack0xffffffffffffff80,false);
  JetHead::ServerSocket::ServerSocket((ServerSocket *)&stack0xffffffffffffff10,false);
  JetHead::Socket::Address::Address((Address *)(server_addr2.mName + 8));
  JetHead::Socket::Address::Address((Address *)(buf + 0x7c));
  for (i_2 = 0; i_2 < 0x80; i_2 = i_2 + 1) {
    *(undefined1 *)((long)&i_1 + (long)i_2) = 0x41;
  }
  buf._120_4_ = JetHead::Socket::write(&stack0xffffffffffffff80,(int)&i_1);
  if (buf._120_4_ != 0xffffffff) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x87,"Writing to an unconnected socket should be an error: %d.",
               (ulong)(uint)buf._120_4_);
  }
  buf._120_4_ = JetHead::Socket::write(&stack0xffffffffffffff80,(int)&i_1);
  if (buf._120_4_ != 0xffffffff) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x8a,"Writing to an unconnected socket should be an error: %d.",
               (ulong)(uint)buf._120_4_);
  }
  buf._120_4_ = JetHead::ServerSocket::bind((Address *)&stack0xffffffffffffff80);
  buf._120_4_ = JetHead::ServerSocket::bind((Address *)&stack0xffffffffffffff10);
  if ((int)buf._120_4_ < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x94,"Bind Failed");
  }
  for (local_1d0 = 0; local_1d0 < 0x80; local_1d0 = local_1d0 + 1) {
    *(undefined1 *)((long)&i_1 + (long)local_1d0) = 0x42;
  }
  buf._120_4_ = JetHead::Socket::write(&stack0xffffffffffffff10,(int)&i_1);
  if (buf._120_4_ != 0xffffffff) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x9c,"Writing to a socket before it has an address should be an \t\t erro: %d ",
               (ulong)(uint)buf._120_4_);
  }
  JetHead::Socket::getLocalAddress((Address *)&stack0xffffffffffffff10);
  JetHead::Socket::Address::setAddress(buf + 0x7c);
  for (local_1d4 = 0; local_1d4 < 0x80; local_1d4 = local_1d4 + 1) {
    *(undefined1 *)((long)&i_1 + (long)local_1d4) = 0x43;
  }
  buf._120_4_ = JetHead::Socket::write(&stack0xffffffffffffff10,(int)&i_1);
  if (buf._120_4_ != 0xffffffff) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0xa7,"Writing to a non-connected socket should be an error: %d.",
               (ulong)(uint)buf._120_4_);
  }
  JetHead::Socket::Socket((Socket *)(sock_addr.mName + 8),false);
  JetHead::Socket::Address::Address((Address *)(test_addr.mName + 0xc));
  test_addr.mName[8] = '\0';
  test_addr.mName[9] = '\0';
  test_addr.mName[10] = '\0';
  test_addr.mName[0xb] = '\0';
  for (; (int)test_addr.mName._8_4_ < 0x80; test_addr.mName._8_4_ = test_addr.mName._8_4_ + 1) {
    *(undefined1 *)((long)&i_1 + (long)(int)test_addr.mName._8_4_) = 0x44;
  }
  buf._120_4_ = JetHead::Socket::write(sock_addr.mName + 8,(int)&i_1);
  if (buf._120_4_ != 0xffffffff) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0xb4,"Writing to an unconnected socket should be an error: %d.",
               (ulong)(uint)buf._120_4_);
  }
  JetHead::Socket::Address::Address((Address *)local_294,"127.0.0.1",0x1771);
  buf._120_4_ = JetHead::Socket::connect((Address *)(sock_addr.mName + 8));
  if ((int)buf._120_4_ < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0xb9,"Connect failed %d.",(ulong)(uint)buf._120_4_);
  }
  JetHead::Socket::getLocalAddress((Address *)(sock_addr.mName + 8));
  buf._120_4_ = JetHead::Socket::write(sock_addr.mName + 8,(int)&i_1);
  if ((int)buf._120_4_ < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0xc0,"Write failed %d.",(ulong)(uint)buf._120_4_);
  }
  buf._120_4_ = JetHead::Socket::read(sock_addr.mName + 8,(int)&i_1);
  if (buf._120_4_ != 0xffffffff) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,199,"reading from a socket that is connected to nothing should fail %d.",
               (ulong)(uint)buf._120_4_);
  }
  buf._120_4_ = JetHead::Socket::close();
  if ((int)buf._120_4_ < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0xcb,"Close failed: %d.",(ulong)(uint)buf._120_4_);
  }
  buf._120_4_ = JetHead::Socket::write(sock_addr.mName + 8,(int)&i_1);
  if (buf._120_4_ != 0xffffffff) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0xcf,"Writing to a closed socket should be an error: %d.",(ulong)(uint)buf._120_4_);
  }
  buf._120_4_ = JetHead::Socket::write(sock_addr.mName + 8,(int)&i_1);
  if (buf._120_4_ != 0xffffffff) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0xd3,"Writing to a closed socket should be an error: %d.",(ulong)(uint)buf._120_4_);
  }
  JetHead::Socket::Address::~Address((Address *)local_294);
  JetHead::Socket::Address::~Address((Address *)(test_addr.mName + 0xc));
  JetHead::Socket::~Socket((Socket *)(sock_addr.mName + 8));
  JetHead::Socket::Address::~Address((Address *)(buf + 0x7c));
  JetHead::Socket::Address::~Address((Address *)(server_addr2.mName + 8));
  JetHead::ServerSocket::~ServerSocket((ServerSocket *)&stack0xffffffffffffff10);
  JetHead::ServerSocket::~ServerSocket((ServerSocket *)&stack0xffffffffffffff80);
  return;
}

Assistant:

void UdpSocketTest::test2()
{
 
  ServerSocket server(false), server2(false);
  Socket::Address server_addr, server_addr2;
  int res;

  char buf[128];
  for (int i = 0; i < 128; i++)
    buf[i] = 'A';

  res = server.write(buf, 128);
  if( res != -1 )
    TestFailed("Writing to an unconnected socket should be an error: %d.", res);
  res = server.write(buf, 128);
  if( res != -1 )
    TestFailed("Writing to an unconnected socket should be an error: %d.", res);

  // This fails...
  res = server.bind(server_addr);
  //if ( res < 0 )
  //TestFailed( "Bind Failed" );


   res = server2.bind(server_addr2);
   if ( res < 0 )
     TestFailed( "Bind Failed" );

   for (int i = 0; i < 128; i++)
     buf[i] = 'B';

   res = server2.write(buf, 128);
   if( res != -1 )
     TestFailed("Writing to a socket before it has an address should be an \
		 erro: %d ", res);

  server2.getLocalAddress( server_addr2 );  
  server_addr2.setAddress( "127.0.0.1" );
  //cerr << "Server name " << server_addr2.getName() << " " << server_addr2.getPort()  << endl;

  for (int i = 0; i < 128; i++)
    buf[i] = 'C';

  res = server2.write(buf, 128);
  if ( res != -1 )
    TestFailed("Writing to a non-connected socket should be an error: %d.", res);



  // Create a socket: write before being connected, connect, write, read.
  Socket sock(false);
  Socket::Address sock_addr;
  for (int i = 0; i < 128; i++)
    buf[i] = 'D';


  res = sock.write(buf, 128);
  if ( res != -1 )
    TestFailed("Writing to an unconnected socket should be an error: %d.", res);

  Socket::Address test_addr("127.0.0.1", 6001);
  res = sock.connect(test_addr);
  if( res < 0 )
    TestFailed("Connect failed %d.", res);

  sock.getLocalAddress( sock_addr );
  //cerr << "Sock name " << sock_addr.getName() << " " << sock_addr.getPort()  << endl;
  
  res = sock.write(buf, 128);
  if( res < 0 )
    TestFailed("Write failed %d.", res);


  // This will fail unless there is an other socket connected to this one
  // nc -u -p 6001 127.0.0.1 <sock_addr.getPort()>
  res = sock.read(buf, 128);
  if( res != -1)
    TestFailed("reading from a socket that is connected to nothing should fail %d.", res);

  res = sock.close();
  if( res < 0 )
    TestFailed("Close failed: %d.", res);
  
  res = sock.write(buf, 128);
  if ( res != -1 )
    TestFailed("Writing to a closed socket should be an error: %d.", res);
  
  res = sock.write(buf, 128);
  if ( res != -1 )
    TestFailed("Writing to a closed socket should be an error: %d.", res);
 
}